

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

SyntaxKind slang::syntax::SyntaxFacts::getBinaryExpression(TokenKind kind)

{
  undefined2 in_register_0000003a;
  
  switch(CONCAT22(in_register_0000003a,kind)) {
  case 0x1a:
    return DivideExpression;
  case 0x1b:
    return MultiplyExpression;
  case 0x1c:
    return PowerExpression;
  case 0x1d:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x38:
  case 0x49:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
    goto switchD_00698288_caseD_1d;
  case 0x1e:
    return AddExpression;
  case 0x23:
    return SubtractExpression;
  case 0x26:
    return LogicalImplicationExpression;
  case 0x2b:
  case 0x33:
    return BinaryXnorExpression;
  case 0x32:
    return BinaryXorExpression;
  case 0x34:
    return AssignmentExpression;
  case 0x35:
    return EqualityExpression;
  case 0x36:
    return WildcardEqualityExpression;
  case 0x37:
    return CaseEqualityExpression;
  case 0x39:
    return AddAssignmentExpression;
  case 0x3a:
    return SubtractAssignmentExpression;
  case 0x3b:
    return DivideAssignmentExpression;
  case 0x3c:
    return MultiplyAssignmentExpression;
  case 0x3d:
    return AndAssignmentExpression;
  case 0x3e:
    return OrAssignmentExpression;
  case 0x3f:
    return ModAssignmentExpression;
  case 0x40:
    return XorAssignmentExpression;
  case 0x41:
    return LogicalLeftShiftAssignmentExpression;
  case 0x42:
    return ArithmeticLeftShiftAssignmentExpression;
  case 0x43:
    return LogicalRightShiftAssignmentExpression;
  case 0x44:
    return ArithmeticRightShiftAssignmentExpression;
  case 0x45:
    return LogicalShiftLeftExpression;
  case 0x46:
    return LogicalShiftRightExpression;
  case 0x47:
    return ArithmeticShiftLeftExpression;
  case 0x48:
    return ArithmeticShiftRightExpression;
  case 0x4a:
    return InequalityExpression;
  case 0x4b:
    return WildcardInequalityExpression;
  case 0x4c:
    return CaseInequalityExpression;
  case 0x4d:
    return ModExpression;
  case 0x4e:
    return LessThanExpression;
  case 0x4f:
    return LessThanEqualExpression;
  case 0x50:
    return LogicalEquivalenceExpression;
  case 0x51:
    return GreaterThanExpression;
  case 0x52:
    return GreaterThanEqualExpression;
  case 0x53:
    return BinaryOrExpression;
  case 0x54:
    return LogicalOrExpression;
  case 0x59:
    return BinaryAndExpression;
  case 0x5a:
    return LogicalAndExpression;
  default:
    if (CONCAT22(in_register_0000003a,kind) == 0x8a) {
      return ExpressionOrDist;
    }
    if (CONCAT22(in_register_0000003a,kind) == 0xc3) {
      return InsideExpression;
    }
switchD_00698288_caseD_1d:
    return Unknown;
  }
}

Assistant:

SyntaxKind SyntaxFacts::getBinaryExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::Plus: return SyntaxKind::AddExpression;
        case TokenKind::Minus: return SyntaxKind::SubtractExpression;
        case TokenKind::Star: return SyntaxKind::MultiplyExpression;
        case TokenKind::Slash: return SyntaxKind::DivideExpression;
        case TokenKind::Percent: return SyntaxKind::ModExpression;
        case TokenKind::DoubleStar: return SyntaxKind::PowerExpression;
        case TokenKind::DoubleEquals: return SyntaxKind::EqualityExpression;
        case TokenKind::ExclamationEquals: return SyntaxKind::InequalityExpression;
        case TokenKind::TripleEquals: return SyntaxKind::CaseEqualityExpression;
        case TokenKind::ExclamationDoubleEquals: return SyntaxKind::CaseInequalityExpression;
        case TokenKind::DoubleEqualsQuestion: return SyntaxKind::WildcardEqualityExpression;
        case TokenKind::ExclamationEqualsQuestion: return SyntaxKind::WildcardInequalityExpression;
        case TokenKind::DoubleAnd: return SyntaxKind::LogicalAndExpression;
        case TokenKind::DoubleOr: return SyntaxKind::LogicalOrExpression;
        case TokenKind::MinusArrow: return SyntaxKind::LogicalImplicationExpression;
        case TokenKind::LessThanMinusArrow: return SyntaxKind::LogicalEquivalenceExpression;
        case TokenKind::LessThan: return SyntaxKind::LessThanExpression;
        case TokenKind::LessThanEquals: return SyntaxKind::LessThanEqualExpression;
        case TokenKind::GreaterThan: return SyntaxKind::GreaterThanExpression;
        case TokenKind::GreaterThanEquals: return SyntaxKind::GreaterThanEqualExpression;
        case TokenKind::And: return SyntaxKind::BinaryAndExpression;
        case TokenKind::Or: return SyntaxKind::BinaryOrExpression;
        case TokenKind::Xor: return SyntaxKind::BinaryXorExpression;
        case TokenKind::XorTilde: return SyntaxKind::BinaryXnorExpression;
        case TokenKind::TildeXor: return SyntaxKind::BinaryXnorExpression;
        case TokenKind::RightShift: return SyntaxKind::LogicalShiftRightExpression;
        case TokenKind::TripleRightShift: return SyntaxKind::ArithmeticShiftRightExpression;
        case TokenKind::LeftShift: return SyntaxKind::LogicalShiftLeftExpression;
        case TokenKind::TripleLeftShift: return SyntaxKind::ArithmeticShiftLeftExpression;
        case TokenKind::InsideKeyword: return SyntaxKind::InsideExpression;
        case TokenKind::Equals: return SyntaxKind::AssignmentExpression;
        case TokenKind::PlusEqual: return SyntaxKind::AddAssignmentExpression;
        case TokenKind::MinusEqual: return SyntaxKind::SubtractAssignmentExpression;
        case TokenKind::StarEqual: return SyntaxKind::MultiplyAssignmentExpression;
        case TokenKind::SlashEqual: return SyntaxKind::DivideAssignmentExpression;
        case TokenKind::PercentEqual: return SyntaxKind::ModAssignmentExpression;
        case TokenKind::AndEqual: return SyntaxKind::AndAssignmentExpression;
        case TokenKind::OrEqual: return SyntaxKind::OrAssignmentExpression;
        case TokenKind::XorEqual: return SyntaxKind::XorAssignmentExpression;
        case TokenKind::LeftShiftEqual: return SyntaxKind::LogicalLeftShiftAssignmentExpression;
        case TokenKind::TripleLeftShiftEqual: return SyntaxKind::ArithmeticLeftShiftAssignmentExpression;
        case TokenKind::RightShiftEqual: return SyntaxKind::LogicalRightShiftAssignmentExpression;
        case TokenKind::TripleRightShiftEqual: return SyntaxKind::ArithmeticRightShiftAssignmentExpression;
        case TokenKind::DistKeyword: return SyntaxKind::ExpressionOrDist;
        default: return SyntaxKind::Unknown;
    }
}